

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64_t max_mem)

{
  ushort uVar1;
  Regexp *this;
  bool bVar2;
  bool bVar3;
  Frag FVar4;
  Frag FVar5;
  Prog *pPVar6;
  bool bVar7;
  Regexp *sre;
  Regexp *local_c8;
  Compiler local_c0;
  
  Compiler(&local_c0);
  uVar1 = re->parse_flags_;
  (local_c0.prog_)->flags_ = (uint)uVar1;
  if ((uVar1 & 0x20) != 0) {
    local_c0.encoding_ = kEncodingLatin1;
  }
  if (max_mem < 1) {
    local_c0.max_ninst_ = 100000;
  }
  else {
    local_c0.max_ninst_ = 0;
    if (0x1a0 < (ulong)max_mem) {
      local_c0.max_ninst_ = 0x1000000;
      if (max_mem - 0x1a0U < 0x8000000) {
        local_c0.max_ninst_ = (int)(max_mem - 0x1a0U >> 3);
      }
    }
  }
  local_c0.anchor_ = UNANCHORED;
  local_c0.reversed_ = reversed;
  local_c0.max_mem_ = max_mem;
  local_c8 = Regexp::Simplify(re);
  if (local_c8 != (Regexp *)0x0) {
    bVar2 = IsAnchorStart(&local_c8,0);
    bVar3 = IsAnchorEnd(&local_c8,0);
    this = local_c8;
    local_c0.super_Walker<re2::Frag>.max_visits_ = local_c0.max_ninst_ * 2;
    FVar4 = Regexp::Walker<re2::Frag>::WalkInternal
                      (&local_c0.super_Walker<re2::Frag>,local_c8,(Frag)0x0,false);
    Regexp::Decref(this);
    if (local_c0.failed_ == false) {
      local_c0.reversed_ = false;
      FVar5 = Match(&local_c0,0);
      FVar4 = Cat(&local_c0,FVar4,FVar5);
      (local_c0.prog_)->reversed_ = reversed;
      bVar7 = bVar3;
      if (reversed) {
        bVar7 = bVar2;
        bVar2 = bVar3;
      }
      (local_c0.prog_)->anchor_start_ = bVar2;
      (local_c0.prog_)->anchor_end_ = bVar7;
      (local_c0.prog_)->start_ = FVar4.begin;
      if (bVar2 == false) {
        FVar5 = ByteRange(&local_c0,0,0xff,false);
        FVar5 = Star(&local_c0,FVar5,true);
        FVar4 = Cat(&local_c0,FVar5,FVar4);
      }
      (local_c0.prog_)->start_unanchored_ = FVar4.begin;
      pPVar6 = Finish(&local_c0);
      goto LAB_001c2837;
    }
  }
  pPVar6 = (Prog *)0x0;
LAB_001c2837:
  ~Compiler(&local_c0);
  return pPVar6;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, RE2::UNANCHORED /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  all = c.Cat(all, c.Match(0));

  c.prog_->set_reversed(reversed);
  if (c.prog_->reversed()) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  c.prog_->set_start(all.begin);
  if (!c.prog_->anchor_start()) {
    // Also create unanchored version, which starts with a .*? loop.
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start_unanchored(all.begin);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}